

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

bool __thiscall
crnlib::mipmapped_texture::read_crn_from_memory
          (mipmapped_texture *this,void *pData,uint data_size,char *pFilename)

{
  mipmapped_texture *pmVar1;
  bool bVar2;
  int iVar3;
  mip_level *pmVar4;
  dxt_image *this_00;
  uint32 row_pitch_in_bytes;
  uint f;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  char *p;
  ulong uVar8;
  uint l;
  ulong unaff_R12;
  ulong uVar9;
  uint l_1;
  ulong uVar10;
  face_vec faces;
  vector<unsigned_char> dxt_data;
  void *pFaces [6];
  vector<crnlib::vector<crnlib::mip_level_*>_> local_100;
  crnd_unpack_context local_f0;
  dynamic_string *local_e8;
  ulong local_e0;
  uint local_d4;
  pixel_format local_d0;
  dxt_format local_cc;
  crn_texture_info local_c8;
  mipmapped_texture *local_a0;
  vector<unsigned_char> local_98;
  char *local_80;
  dynamic_string local_78;
  void *local_68 [7];
  
  local_80 = pFilename;
  clear(this);
  local_e8 = &this->m_last_error;
  local_a0 = this;
  dynamic_string::operator=(local_e8,"Image file load failed");
  if (data_size != 0 && pData != (void *)0x0) {
    local_c8.m_struct_size = 0x28;
    bVar2 = crnd::crnd_get_texture_info(pData,data_size,&local_c8);
    if (bVar2) {
      local_d0 = crnd::crnd_crn_format_to_fourcc(local_c8.m_format);
      if (local_d0 != PIXEL_FMT_INVALID) {
        local_cc = pixel_format_helpers::get_dxt_format(local_d0);
        vector<crnlib::vector<crnlib::mip_level_*>_>::vector(&local_100,local_c8.m_faces);
        for (uVar6 = 0; uVar6 < local_c8.m_faces; uVar6 = uVar6 + 1) {
          vector<crnlib::mip_level_*>::resize(local_100.m_p + uVar6,local_c8.m_levels,false);
          for (unaff_R12 = 0; unaff_R12 < local_c8.m_levels; unaff_R12 = unaff_R12 + 1) {
            pmVar4 = crnlib_new<crnlib::mip_level>();
            local_100.m_p[uVar6].m_p[unaff_R12] = pmVar4;
          }
        }
        local_98.m_p = (uchar *)0x0;
        local_98.m_size = 0;
        local_98.m_capacity = 0;
        vector<unsigned_char>::resize
                  (&local_98,
                   (local_c8.m_width + 3 >> 2) * local_c8.m_faces * (local_c8.m_height + 3 >> 2) *
                   local_c8.m_bytes_per_block,false);
        dynamic_string::operator=(local_e8,"CRN unpack failed");
        local_f0 = crnd::crnd_unpack_begin(pData,data_size);
        if (local_f0 == (crnd_unpack_context)0x0) {
          for (uVar6 = 0; uVar6 < local_100.m_size; uVar6 = uVar6 + 1) {
            for (uVar10 = 0; uVar10 < local_100.m_p[uVar6].m_size; uVar10 = uVar10 + 1) {
              crnlib_delete<crnlib::mip_level>(local_100.m_p[uVar6].m_p[uVar10]);
            }
          }
          uVar9 = 0;
        }
        else {
          uVar10 = (ulong)local_c8.m_faces;
          for (uVar6 = uVar10; uVar6 < 6; uVar6 = uVar6 + 1) {
            local_68[uVar6] = (void *)0x0;
          }
          uVar6 = 0;
          while (uVar9 = CONCAT71((int7)(unaff_R12 >> 8),local_c8.m_levels <= uVar6),
                local_c8.m_levels > uVar6) {
            uVar5 = local_c8.m_width >> ((byte)uVar6 & 0x1f);
            uVar7 = local_c8.m_height >> ((byte)uVar6 & 0x1f);
            row_pitch_in_bytes = local_c8.m_bytes_per_block * (uVar5 + (uVar5 == 0) + 3 >> 2);
            uVar5 = 0;
            for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
              local_68[uVar8] = local_98.m_p + uVar5;
              uVar5 = uVar5 + row_pitch_in_bytes * (uVar7 + (uVar7 == 0) + 3 >> 2);
            }
            local_e0 = uVar6;
            bVar2 = crnd::crnd_unpack_level
                              (local_f0,local_68,local_98.m_size,row_pitch_in_bytes,(uint32)uVar6);
            if (!bVar2) {
              crnd::crnd_unpack_end(local_f0);
              for (uVar6 = 0; uVar6 < local_100.m_size; uVar6 = uVar6 + 1) {
                for (uVar10 = 0; uVar10 < local_100.m_p[uVar6].m_size; uVar10 = uVar10 + 1) {
                  crnlib_delete<crnlib::mip_level>(local_100.m_p[uVar6].m_p[uVar10]);
                }
              }
              goto LAB_001272e5;
            }
            local_d4 = (uint)uVar9;
            unaff_R12 = 0;
            for (uVar6 = 0; uVar10 = (ulong)local_c8.m_faces, uVar6 < uVar10; uVar6 = uVar6 + 1) {
              this_00 = crnlib_new<crnlib::dxt_image>();
              iVar3 = dxt_image::init(this_00,(EVP_PKEY_CTX *)(ulong)(uint)local_cc);
              if ((char)iVar3 == '\0') {
                crnlib_delete<crnlib::dxt_image>(this_00);
                crnd::crnd_unpack_end(local_f0);
                uVar9 = (ulong)local_d4;
                for (uVar6 = 0; uVar6 < local_100.m_size; uVar6 = uVar6 + 1) {
                  for (uVar10 = 0; uVar10 < local_100.m_p[uVar6].m_size; uVar10 = uVar10 + 1) {
                    crnlib_delete<crnlib::mip_level>(local_100.m_p[uVar6].m_p[uVar10]);
                  }
                }
                goto LAB_001272e5;
              }
              mip_level::assign(*(mip_level **)
                                 (*(long *)((long)&(local_100.m_p)->m_p + unaff_R12 * 2) +
                                 local_e0 * 8),this_00,local_d0,cDefaultOrientationFlags);
              unaff_R12 = unaff_R12 + 8;
            }
            uVar6 = local_e0 + 1;
          }
          crnd::crnd_unpack_end(local_f0);
          assign(local_a0,&local_100);
          dynamic_string::dynamic_string(&local_78,local_80);
          pmVar1 = local_a0;
          dynamic_string::operator=(&local_a0->m_name,&local_78);
          dynamic_string::~dynamic_string(&local_78);
          pmVar1->m_source_file_type = cFormatCRN;
          dynamic_string::clear(local_e8);
        }
LAB_001272e5:
        vector<unsigned_char>::~vector(&local_98);
        vector<crnlib::vector<crnlib::mip_level_*>_>::~vector(&local_100);
        return (bool)(char)uVar9;
      }
      p = "Unsupported DXT format";
    }
    else {
      p = "crnd_get_texture_info() failed";
    }
    dynamic_string::operator=(local_e8,p);
  }
  return false;
}

Assistant:

bool mipmapped_texture::read_crn_from_memory(const void* pData, uint data_size, const char* pFilename) {
  clear();

  set_last_error("Image file load failed");

  if ((!pData) || (data_size < 1))
    return false;

  crnd::crn_texture_info tex_info;
  tex_info.m_struct_size = sizeof(crnd::crn_texture_info);
  if (!crnd_get_texture_info(pData, data_size, &tex_info)) {
    set_last_error("crnd_get_texture_info() failed");
    return false;
  }

  const pixel_format dds_fmt = (pixel_format)crnd::crnd_crn_format_to_fourcc(tex_info.m_format);
  if (dds_fmt == PIXEL_FMT_INVALID) {
    set_last_error("Unsupported DXT format");
    return false;
  }

  const dxt_format dxt_fmt = pixel_format_helpers::get_dxt_format(dds_fmt);

  face_vec faces(tex_info.m_faces);
  for (uint f = 0; f < tex_info.m_faces; f++) {
    faces[f].resize(tex_info.m_levels);

    for (uint l = 0; l < tex_info.m_levels; l++)
      faces[f][l] = crnlib_new<mip_level>();
  }

  const uint tex_num_blocks_x = (tex_info.m_width + 3) >> 2;
  const uint tex_num_blocks_y = (tex_info.m_height + 3) >> 2;

  vector<uint8> dxt_data;
  // Create temp buffer big enough to hold the largest mip level, and all faces if it's a cubemap.
  dxt_data.resize(tex_info.m_bytes_per_block * tex_num_blocks_x * tex_num_blocks_y * tex_info.m_faces);

  set_last_error("CRN unpack failed");

#if 0
      timer t;
      double total_time = 0.0f;
      t.start();
#endif

  crnd::crnd_unpack_context pContext = crnd::crnd_unpack_begin(pData, data_size);

#if 0
      total_time += t.get_elapsed_secs();
#endif

  if (!pContext) {
    for (uint f = 0; f < faces.size(); f++)
      for (uint l = 0; l < faces[f].size(); l++)
        crnlib_delete(faces[f][l]);
    return false;
  }

  uint total_pixels = 0;

  void* pFaces[cCRNMaxFaces];
  for (uint f = tex_info.m_faces; f < cCRNMaxFaces; f++)
    pFaces[f] = nullptr;

  for (uint l = 0; l < tex_info.m_levels; l++) {
    const uint level_width = math::maximum<uint>(1U, tex_info.m_width >> l);
    const uint level_height = math::maximum<uint>(1U, tex_info.m_height >> l);
    const uint num_blocks_x = (level_width + 3U) >> 2U;
    const uint num_blocks_y = (level_height + 3U) >> 2U;

    const uint row_pitch = num_blocks_x * tex_info.m_bytes_per_block;
    const uint size_of_face = num_blocks_y * row_pitch;

    total_pixels += num_blocks_x * num_blocks_y * 4 * 4 * tex_info.m_faces;

#if 0
         t.start();
#endif

    for (uint f = 0; f < tex_info.m_faces; f++)
      pFaces[f] = &dxt_data[f * size_of_face];

    if (!crnd::crnd_unpack_level(pContext, pFaces, dxt_data.size(), row_pitch, l)) {
      crnd::crnd_unpack_end(pContext);
      for (uint f = 0; f < faces.size(); f++)
        for (uint l = 0; l < faces[f].size(); l++)
          crnlib_delete(faces[f][l]);
      return false;
    }

#if 0
         total_time += t.get_elapsed_secs();
#endif

    for (uint f = 0; f < tex_info.m_faces; f++) {
      dxt_image* pDXT_image = crnlib_new<dxt_image>();

      if (!pDXT_image->init(
              dxt_fmt, level_width, level_height,
              num_blocks_x * num_blocks_y * (tex_info.m_bytes_per_block / sizeof(dxt_image::element)),
              reinterpret_cast<dxt_image::element*>(pFaces[f]), true)) {
        crnlib_delete(pDXT_image);

        crnd::crnd_unpack_end(pContext);
        for (uint f = 0; f < faces.size(); f++)
          for (uint l = 0; l < faces[f].size(); l++)
            crnlib_delete(faces[f][l]);

        return false;
      }

      faces[f][l]->assign(pDXT_image, dds_fmt);
    }
  }

#if 0
      if (total_pixels)
      {
         console::info("read_crn_from_memory: Total pixels: %u, ms: %3.3fms, megapixels/sec: %3.3f",
            total_pixels, total_time * 1000.0f, total_pixels / total_time);
      }
#endif

  crnd::crnd_unpack_end(pContext);

  assign(faces);
  set_name(pFilename);

  m_source_file_type = texture_file_types::cFormatCRN;
  clear_last_error();

  return true;
}